

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O2

Test * anon_unknown.dwarf_78567::DiskInterfaceTestStatExistingFile::Create(void)

{
  DiskInterfaceTest *this;
  
  this = (DiskInterfaceTest *)operator_new(0x58);
  DiskInterfaceTest::DiskInterfaceTest(this);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__DiskInterfaceTest_001e20b8;
  g_current_test = (Test *)this;
  return &this->super_Test;
}

Assistant:

TEST_F(DiskInterfaceTest, StatExistingFile) {
  string err;
  ASSERT_TRUE(Touch("file"));
  EXPECT_GT(disk_.Stat("file", &err), 1);
  EXPECT_EQ("", err);
}